

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::Expression::convertAssignment
          (ASTContext *context,Type *type,Expression *expr,SourceLocation location,
          Expression **lhsExpr,bitmask<slang::ast::AssignFlags> *assignFlags)

{
  byte *pbVar1;
  bool bVar2;
  bitwidth_t bVar3;
  bitwidth_t bVar4;
  Compilation *pCVar5;
  Expression *pEVar6;
  Type *pTVar7;
  InstanceSymbolBase *expr_00;
  StreamingConcatenationExpression *rhs;
  Expression *args_2;
  OpenRangeExpression *pOVar8;
  Diagnostic *diag;
  Type *this;
  IntegerLiteral *pIVar9;
  Diagnostic *pDVar10;
  ConversionExpression **expr_01;
  InstanceSymbolBase *instance;
  DiagCode code;
  ConversionExpression *local_58;
  Expression *conn;
  OpenRangeExpression *local_48;
  Compilation *local_40;
  not_null<const_slang::ast::Type_*> *local_38;
  
  instance = (InstanceSymbolBase *)lhsExpr;
  bVar2 = bad(expr);
  if (bVar2) {
    return expr;
  }
  pCVar5 = ASTContext::getCompilation(context);
  bVar2 = Type::isError(type);
  if (bVar2) {
    pEVar6 = badExpr(pCVar5,expr);
    return pEVar6;
  }
  local_38 = &expr->type;
  local_58 = (ConversionExpression *)expr;
  pTVar7 = not_null<const_slang::ast::Type_*>::get(local_38);
  bVar2 = Type::isEquivalent(type,pTVar7);
  if (!bVar2) {
    local_40 = pCVar5;
    expr_00 = ASTContext::getInstance(context);
    if ((expr_00 != (InstanceSymbolBase *)0x0) && ((expr_00->arrayPath).size_ != 0)) {
      bVar3 = Type::getBitWidth(type);
      local_48 = (OpenRangeExpression *)CONCAT44(local_48._4_4_,bVar3);
      bVar3 = Type::getBitWidth(pTVar7);
      if (((bitwidth_t)local_48 != bVar3) ||
         (bVar2 = Type::isAssignmentCompatible(type,pTVar7), !bVar2)) {
        if (lhsExpr == (Expression **)0x0) {
          conn = tryConnectPortArray((Expression *)context,(ASTContext *)type,(Type *)expr,
                                     (Expression *)expr_00,instance);
          if (conn != (Expression *)0x0) {
            expr_01 = (ConversionExpression **)&conn;
            goto LAB_00306fa0;
          }
        }
        else {
          conn = tryConnectPortArray((Expression *)context,(ASTContext *)pTVar7,(Type *)*lhsExpr,
                                     (Expression *)expr_00,instance);
          if (conn != (Expression *)0x0) {
            selfDetermined(context,&conn);
            *lhsExpr = conn;
            if (assignFlags == (bitmask<slang::ast::AssignFlags> *)0x0) {
              assert::assertFailed
                        ("assignFlags",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,0x111,
                         "static Expression &slang::ast::Expression::convertAssignment(const ASTContext &, const Type &, Expression &, SourceLocation, Expression **, bitmask<AssignFlags> *)"
                        );
            }
            pbVar1 = (byte *)((long)&assignFlags->m_bits + 1);
            *pbVar1 = *pbVar1 | 1;
            goto LAB_00306f9b;
          }
        }
      }
    }
    bVar2 = Type::isAssignmentCompatible(type,pTVar7);
    pCVar5 = local_40;
    if (!bVar2) {
      bVar2 = isImplicitlyAssignableTo(expr,local_40,type);
      if (bVar2) goto LAB_0030714c;
      if (expr->kind == OpenRange) {
        local_48 = as<slang::ast::OpenRangeExpression>(expr);
        pEVar6 = convertAssignment(context,type,local_48->left_,location,lhsExpr,assignFlags);
        args_2 = convertAssignment(context,type,local_48->right_,location,lhsExpr,assignFlags);
        pTVar7 = not_null<const_slang::ast::Type_*>::get(local_38);
        pOVar8 = BumpAllocator::
                 emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                           (&local_40->super_BumpAllocator,pTVar7,pEVar6,args_2,&expr->sourceRange);
        (pOVar8->super_Expression).syntax = expr->syntax;
        return &pOVar8->super_Expression;
      }
      if (expr->kind != Streaming) {
        code.subsystem = Expressions;
        code.code = 0x1b;
        if ((((context->flags).m_bits & 0x40000000) == 0) &&
           ((bVar2 = Type::isCastCompatible(type,pTVar7), bVar2 ||
            (bVar2 = Type::isBitstreamCastable(type,pTVar7), bVar2)))) {
          code.subsystem = Expressions;
          code.code = 0x70;
        }
        pDVar10 = ASTContext::addDiag(context,code,location);
        diag = ast::operator<<(pDVar10,pTVar7);
        ast::operator<<(diag,type);
        if (lhsExpr != (Expression **)0x0) {
          Diagnostic::operator<<(pDVar10,(*lhsExpr)->sourceRange);
        }
        Diagnostic::operator<<(pDVar10,expr->sourceRange);
LAB_0030737c:
        pEVar6 = badExpr(pCVar5,expr);
        return pEVar6;
      }
      rhs = as<slang::ast::StreamingConcatenationExpression>(expr);
      bVar2 = Bitstream::canBeSource(type,rhs,location,context);
      if (!bVar2) goto LAB_0030737c;
      conn = (Expression *)CONCAT44(conn._4_4_,2);
      local_58 = BumpAllocator::
                 emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                           (&pCVar5->super_BumpAllocator,type,(ConversionKind *)&conn,expr,
                            &expr->sourceRange);
      expr_01 = &local_58;
      goto LAB_00306fa0;
    }
    bVar2 = Type::isNumeric(type);
    pCVar5 = local_40;
    if ((!bVar2) || (bVar2 = Type::isNumeric(pTVar7), !bVar2)) {
LAB_0030714c:
      pEVar6 = ConversionExpression::makeImplicit(context,type,Implicit,expr,location);
      return pEVar6;
    }
    if (((context->flags).m_bits & 8) != 0) {
      this = not_null<const_slang::ast::Type_*>::get(local_38);
      bVar2 = Type::isIntegral(this);
      if (!bVar2) {
        ASTContext::addDiag(context,(DiagCode)0x40003,expr->sourceRange);
        goto LAB_0030737c;
      }
      bVar3 = Type::getBitWidth(type);
      bVar4 = Type::getBitWidth(this);
      if (((bVar3 != bVar4) && (expr->kind == IntegerLiteral)) &&
         (pIVar9 = as<slang::ast::IntegerLiteral>(expr), pIVar9->isDeclaredUnsized == false)) {
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x450007,expr->sourceRange);
        bVar3 = Type::getBitWidth(this);
        pDVar10 = Diagnostic::operator<<(pDVar10,bVar3);
        bVar3 = Type::getBitWidth(type);
        Diagnostic::operator<<(pDVar10,bVar3);
        goto LAB_0030737c;
      }
    }
    pTVar7 = binaryOperatorType(pCVar5,type,pTVar7,false,true);
    bVar2 = Type::isEquivalent(type,pTVar7);
    if (bVar2) {
      pTVar7 = type;
    }
    contextDetermined(context,(Expression **)&local_58,pTVar7,location);
    if (bVar2) {
      return &local_58->super_Expression;
    }
    expr = &local_58->super_Expression;
    if (((context->flags).m_bits & 8) == 0) goto LAB_0030714c;
  }
LAB_00306f9b:
  expr_01 = &local_58;
LAB_00306fa0:
  selfDetermined(context,(Expression **)expr_01);
  return &(*expr_01)->super_Expression;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceLocation location,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;
    if (type.isEquivalent(*rt)) {
        selfDetermined(context, result);
        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, location);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(), location,
                                       context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }
        else if (expr.kind == ExpressionKind::OpenRange) {
            // Convert each side of the range and return that as a new range.
            auto& ore = expr.as<OpenRangeExpression>();
            auto& left = convertAssignment(context, type, ore.left(), location, lhsExpr,
                                           assignFlags);
            auto& right = convertAssignment(context, type, ore.right(), location, lhsExpr,
                                            assignFlags);

            result = comp.emplace<OpenRangeExpression>(*expr.type, left, right, expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, location);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        if (context.flags.has(ASTFlags::EnumInitializer) &&
            !checkEnumInitializer(context, type, *result)) {
            return badExpr(comp, &expr);
        }

        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = binaryOperatorType(comp, &type, rt, false, /* signednessFromRt */ true);
        bool expanding = type.isEquivalent(*rt);
        if (expanding)
            rt = &type;

        contextDetermined(context, result, *rt, location);
        if (expanding)
            return *result;

        // Do not convert (truncate) enum initializer so out of range value can be checked.
        if (context.flags.has(ASTFlags::EnumInitializer)) {
            selfDetermined(context, result);
            return *result;
        }
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              location);
}